

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O0

hash_func_t getHasher(string *s)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  string *in_RDI;
  stringstream __msg;
  char *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  vw_exception *in_stack_fffffffffffffe50;
  stringstream local_198 [16];
  ostream local_188;
  string *local_10;
  hash_func_t local_8;
  
  local_10 = in_RDI;
  bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  if (bVar1) {
    local_8 = hashstring;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_198);
      poVar2 = std::operator<<(&local_188,"Unknown hash function: ");
      std::operator<<(poVar2,local_10);
      uVar3 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                 in_stack_fffffffffffffe38);
      __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_8 = hashall;
  }
  return local_8;
}

Assistant:

hash_func_t getHasher(const std::string& s)
{
  if (s == "strings")
    return hashstring;
  else if (s == "all")
    return hashall;
  else
    THROW("Unknown hash function: " << s);
}